

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameEngine::finishStep(GameEngine *this)

{
  bool end_00;
  size_type sVar1;
  bool end;
  GameEngine *this_local;
  
  end_00 = calculate(this);
  notify(this,end_00);
  if (!end_00) {
    this->currentStep = this->currentStep + 1;
    this->currentPlayer = this->currentPlayer + 1;
    sVar1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::size
                      (&this->players);
    this->currentPlayer = (int32_t)((ulong)(long)this->currentPlayer % sVar1);
    nextStep(this);
  }
  return;
}

Assistant:

void GameEngine::finishStep() {
  bool end = calculate();
  notify(end);

  if (!end) {
    ++currentStep;
    ++currentPlayer;
    currentPlayer %= players.size();
    nextStep();
  }
}